

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmdline_parser.cpp
# Opt level: O2

void __thiscall
tlx::CmdlineParser::add_stringlist
          (CmdlineParser *this,char key,string *longkey,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *dest,string *desc)

{
  allocator local_51;
  string local_50;
  
  std::__cxx11::string::string((string *)&local_50,"",&local_51);
  add_stringlist(this,key,longkey,&local_50,dest,desc);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void CmdlineParser::add_stringlist(
    char key, const std::string& longkey,
    std::vector<std::string>& dest, const std::string& desc) {
    return add_stringlist(key, longkey, "", dest, desc);
}